

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *message;
  AssertHelper local_58 [3];
  Message local_40;
  int local_34;
  unsigned_long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *this_local;
  
  VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::__0>
            ((this->super_VisitFieldsTest).message_,
             (anon_class_1_0_00000001 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7),kAll);
  iVar2 = (*(((this->super_VisitFieldsTest).message_)->super_MessageLite)._vptr_MessageLite[3])();
  local_30 = CONCAT44(extraout_var,iVar2);
  local_34 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_28,"message_->ByteSizeLong()","0",&local_30,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsMustBeEmpty) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  EXPECT_EQ(message_->ByteSizeLong(), 0);
}